

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_compute_blob.h
# Opt level: O0

void ncnn::gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  float fVar13;
  float __x;
  float fVar14;
  float *value_ptr_1;
  int *offset_ptr_1;
  bool in_bound_11_1;
  bool in_bound_10_1;
  bool in_bound_01_1;
  bool in_bound_00_1;
  bool y1_in_bound_1;
  bool y0_in_bound_1;
  bool x1_in_bound_1;
  bool x0_in_bound_1;
  int y1_1;
  int x1_1;
  int y0_1;
  int x0_1;
  float sample_y_1;
  float sample_x_1;
  int x_1;
  float *gridptr_y;
  float *gridptr_x;
  float *value_ptr;
  int *offset_ptr;
  bool in_bound_11;
  bool in_bound_10;
  bool in_bound_01;
  bool in_bound_00;
  bool y1_in_bound;
  bool y0_in_bound;
  bool x1_in_bound;
  bool x0_in_bound;
  int y1;
  int x1;
  int y0;
  int x0;
  float sample_y;
  float sample_x;
  int x;
  float *gridptr;
  int y;
  compute_coord<(ncnn::GridSample::PaddingMode)2,_true> get_coord;
  grid_sample_unormalize<true> unormalize;
  float *offset_value_ptr;
  int grid_size;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  double in_stack_fffffffffffffaa8;
  compute_coord<(ncnn::GridSample::PaddingMode)2,_true> *in_stack_fffffffffffffab0;
  double local_548;
  double local_540;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  int local_444;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined4 local_428;
  long local_420;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  undefined4 local_40c;
  undefined4 local_408;
  undefined8 local_400;
  float *local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined4 local_3d8;
  long local_3d0;
  undefined4 local_3c8;
  undefined4 local_3c4;
  undefined4 local_3c0;
  undefined4 local_3bc;
  undefined4 local_3b8;
  undefined8 local_3b0;
  float *local_3a8;
  float *local_3a0;
  int *local_398;
  undefined1 local_38c;
  undefined1 local_38b;
  undefined1 local_38a;
  undefined1 local_389;
  undefined1 local_388;
  undefined1 local_387;
  undefined1 local_386;
  undefined1 local_385;
  uint local_384;
  uint local_380;
  uint local_37c;
  uint local_378;
  float local_374;
  float local_370;
  int local_36c;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined4 local_350;
  long local_348;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined8 local_328;
  float *local_320;
  int local_318;
  grid_sample_unormalize<true> local_311;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined4 local_2f8;
  long local_2f0;
  undefined4 local_2e8;
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined8 local_2d0;
  int *local_2c8;
  int local_2c0;
  long *local_2b0;
  long local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_278;
  undefined8 *local_268;
  undefined8 *local_258;
  undefined8 *local_248;
  undefined1 local_21d;
  undefined4 local_21c;
  undefined8 *local_210;
  undefined1 local_1e5;
  undefined4 local_1e4;
  undefined8 *local_1d8;
  undefined1 local_1ad;
  int local_1ac;
  undefined8 *local_1a0;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined8 *local_168;
  undefined1 local_15d;
  undefined4 local_15c;
  undefined8 *local_150;
  undefined8 *local_128;
  long local_120;
  undefined4 local_114;
  long local_110;
  int *local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  float *local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  long local_b0;
  undefined4 local_a4;
  long local_a0;
  float *local_98;
  undefined4 local_8c;
  int local_88;
  int local_84;
  undefined8 *local_80;
  long local_78;
  undefined4 local_6c;
  long local_68;
  float *local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_2c0 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6];
  local_150 = &local_310;
  local_f4 = *(int *)((long)in_RDX + 0x2c);
  local_f8 = (int)in_RDX[6];
  local_fc = *(undefined4 *)((long)in_RDX + 0x34);
  local_2c8 = (int *)*in_RDX;
  local_110 = in_RDX[2];
  local_114 = (undefined4)in_RDX[3];
  local_120 = in_RDX[4];
  local_f0 = &local_310;
  local_8 = (long)local_f4 * (long)local_f8 * local_110;
  local_128 = &local_310;
  local_2a0 = &local_310;
  local_c = 0x10;
  local_15c = 0;
  local_15d = 1;
  local_310 = 0;
  local_300 = 0;
  local_2f8 = 0;
  local_2e8 = 0;
  local_2e4 = 0;
  local_2e0 = 0;
  local_2dc = 0;
  local_2d8 = 0;
  local_2d0 = 0;
  local_308 = 0;
  local_2a8 = in_RDI;
  local_248 = local_2a0;
  local_108 = local_2c8;
  local_2f0 = local_120;
  if (in_ECX == 0) {
    local_2b0 = in_RSI;
    for (local_318 = 0; local_318 < (int)local_2b0[7]; local_318 = local_318 + 1) {
      local_1a0 = &local_368;
      local_bc = *(int *)((long)local_2b0 + 0x2c);
      local_c0 = (int)local_2b0[6];
      local_c4 = *(undefined4 *)((long)local_2b0 + 0x34);
      local_320 = (float *)(*local_2b0 + local_2b0[8] * (long)local_318 * local_2b0[2]);
      local_d8 = local_2b0[2];
      local_dc = (undefined4)local_2b0[3];
      local_e8 = local_2b0[4];
      local_b8 = &local_368;
      local_18 = (long)local_bc * (long)local_c0 * local_d8;
      local_168 = &local_368;
      local_298 = &local_368;
      local_1c = 0x10;
      local_1ac = local_318;
      local_1ad = 1;
      local_368 = 0;
      local_358 = 0;
      local_350 = 0;
      local_340 = 0;
      local_33c = 0;
      local_338 = 0;
      local_334 = 0;
      local_330 = 0;
      local_328 = 0;
      local_360 = 0;
      local_258 = local_298;
      local_d0 = local_320;
      local_348 = local_e8;
      for (local_36c = 0; local_36c < local_2c0; local_36c = local_36c + 2) {
        local_370 = *local_320;
        local_374 = local_320[1];
        local_370 = grid_sample_unormalize<true>::operator()
                              (&local_311,*(int *)(local_2a8 + 0x2c),local_370);
        local_370 = compute_coord<(ncnn::GridSample::PaddingMode)2,_true>::operator()
                              (in_stack_fffffffffffffab0,
                               (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
                               SUB84(in_stack_fffffffffffffaa8,0));
        local_374 = grid_sample_unormalize<true>::operator()
                              (&local_311,*(int *)(local_2a8 + 0x30),local_374);
        local_374 = compute_coord<(ncnn::GridSample::PaddingMode)2,_true>::operator()
                              (in_stack_fffffffffffffab0,
                               (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
                               SUB84(in_stack_fffffffffffffaa8,0));
        fVar13 = floorf(local_370);
        local_378 = (uint)fVar13;
        fVar13 = floorf(local_374);
        local_37c = (uint)fVar13;
        local_380 = local_378 + 1;
        local_384 = local_37c + 1;
        bVar5 = local_378 < 0x80000000;
        bVar1 = (int)local_378 < *(int *)(local_2a8 + 0x2c);
        local_385 = bVar5 && bVar1;
        bVar6 = local_380 < 0x80000000;
        bVar2 = (int)local_380 < *(int *)(local_2a8 + 0x2c);
        local_386 = bVar6 && bVar2;
        bVar7 = local_37c < 0x80000000;
        bVar3 = (int)local_37c < *(int *)(local_2a8 + 0x30);
        local_387 = bVar7 && bVar3;
        bVar8 = local_384 < 0x80000000;
        bVar4 = (int)local_384 < *(int *)(local_2a8 + 0x30);
        local_388 = bVar8 && bVar4;
        local_389 = (bool)local_385 && (bool)local_387;
        local_38a = (bool)local_386 && (bool)local_387;
        local_38b = (bool)local_385 && (bool)local_388;
        local_38c = (bool)local_386 && (bool)local_388;
        local_398 = local_2c8;
        local_3a0 = (float *)(local_2c8 + 4);
        if ((bVar5 && bVar1) && (bVar7 && bVar3)) {
          local_4d0 = (double)(int)((local_378 + local_37c * *(int *)(local_2a8 + 0x2c)) *
                                   *(int *)(local_2a8 + 0x18));
        }
        else {
          local_4d0 = -1.0;
        }
        *local_2c8 = (int)local_4d0;
        if ((bVar6 && bVar2) && (bVar7 && bVar3)) {
          local_4d8 = (double)(int)((local_380 + local_37c * *(int *)(local_2a8 + 0x2c)) *
                                   *(int *)(local_2a8 + 0x18));
        }
        else {
          local_4d8 = -1.0;
        }
        local_2c8[1] = (int)local_4d8;
        if ((bVar5 && bVar1) && (bVar8 && bVar4)) {
          local_4e0 = (double)(int)((local_378 + local_384 * *(int *)(local_2a8 + 0x2c)) *
                                   *(int *)(local_2a8 + 0x18));
        }
        else {
          local_4e0 = -1.0;
        }
        local_2c8[2] = (int)local_4e0;
        if ((bVar6 && bVar2) && (bVar8 && bVar4)) {
          local_4e8 = (double)(int)((local_380 + local_384 * *(int *)(local_2a8 + 0x2c)) *
                                   *(int *)(local_2a8 + 0x18));
        }
        else {
          local_4e8 = -1.0;
        }
        local_2c8[3] = (int)local_4e8;
        *local_3a0 = local_370 - (float)(int)local_378;
        local_2c8[5] = (int)(local_374 - (float)(int)local_37c);
        local_320 = local_320 + 2;
        local_2c8 = local_2c8 + 6;
      }
    }
  }
  else {
    local_1d8 = &local_3f0;
    local_84 = *(int *)((long)in_RSI + 0x2c);
    local_88 = (int)in_RSI[6];
    local_8c = *(undefined4 *)((long)in_RSI + 0x34);
    local_3a8 = (float *)*in_RSI;
    local_a0 = in_RSI[2];
    local_a4 = (undefined4)in_RSI[3];
    local_b0 = in_RSI[4];
    local_80 = &local_3f0;
    local_28 = (long)local_84 * (long)local_88 * local_a0;
    local_170 = &local_3f0;
    local_290 = &local_3f0;
    local_210 = &local_440;
    local_4c = *(int *)((long)in_RSI + 0x2c);
    local_50 = (int)in_RSI[6];
    local_54 = *(undefined4 *)((long)in_RSI + 0x34);
    local_3f8 = (float *)(*in_RSI + in_RSI[8] * in_RSI[2]);
    local_68 = in_RSI[2];
    local_6c = (undefined4)in_RSI[3];
    local_78 = in_RSI[4];
    local_48 = &local_440;
    local_38 = (long)local_4c * (long)local_50 * local_68;
    local_178 = &local_440;
    local_288 = &local_440;
    local_2d8 = 0;
    local_2dc = 0;
    local_2e0 = 0;
    local_2e4 = 0;
    local_2f8 = 0;
    local_300 = 0;
    local_308 = 0;
    local_310 = 0;
    local_3b8 = 0;
    local_3bc = 0;
    local_3c0 = 0;
    local_3c4 = 0;
    local_3d8 = 0;
    local_3e0 = 0;
    local_3e8 = 0;
    local_3f0 = 0;
    local_c = 0x10;
    local_2c = 0x10;
    local_3c = 0x10;
    local_15c = 0;
    local_15d = 1;
    local_1e4 = 0;
    local_1e5 = 1;
    local_21c = 1;
    local_21d = 1;
    local_2d0 = 0;
    local_2e8 = 0;
    local_3b0 = 0;
    local_3c8 = 0;
    local_440 = 0;
    local_430 = 0;
    local_428 = 0;
    local_418 = 0;
    local_414 = 0;
    local_410 = 0;
    local_40c = 0;
    local_408 = 0;
    local_400 = 0;
    local_438 = 0;
    local_278 = local_288;
    local_268 = local_290;
    local_98 = local_3a8;
    local_60 = local_3f8;
    local_420 = local_78;
    local_3d0 = local_b0;
    for (local_444 = 0; local_444 < local_2c0; local_444 = local_444 + 1) {
      fVar13 = *local_3f8;
      grid_sample_unormalize<true>::operator()(&local_311,*(int *)(local_2a8 + 0x2c),*local_3a8);
      __x = compute_coord<(ncnn::GridSample::PaddingMode)2,_true>::operator()
                      (in_stack_fffffffffffffab0,(int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
                       SUB84(in_stack_fffffffffffffaa8,0));
      grid_sample_unormalize<true>::operator()(&local_311,*(int *)(local_2a8 + 0x30),fVar13);
      fVar13 = compute_coord<(ncnn::GridSample::PaddingMode)2,_true>::operator()
                         (in_stack_fffffffffffffab0,(int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
                          SUB84(in_stack_fffffffffffffaa8,0));
      fVar14 = floorf(__x);
      uVar9 = (uint)fVar14;
      fVar14 = floorf(fVar13);
      uVar10 = (uint)fVar14;
      uVar11 = uVar9 + 1;
      uVar12 = uVar10 + 1;
      bVar1 = *(int *)(local_2a8 + 0x2c) <= (int)uVar9;
      bVar2 = *(int *)(local_2a8 + 0x2c) <= (int)uVar11;
      bVar3 = *(int *)(local_2a8 + 0x30) <= (int)uVar10;
      bVar4 = *(int *)(local_2a8 + 0x30) <= (int)uVar12;
      if ((0x7fffffff < uVar9 || bVar1) || (0x7fffffff < uVar10 || bVar3)) {
        local_540 = -1.0;
      }
      else {
        local_540 = (double)(int)((uVar9 + uVar10 * *(int *)(local_2a8 + 0x2c)) *
                                 *(int *)(local_2a8 + 0x18));
      }
      *local_2c8 = (int)local_540;
      if ((0x7fffffff < uVar11 || bVar2) || (0x7fffffff < uVar10 || bVar3)) {
        local_548 = -1.0;
      }
      else {
        local_548 = (double)(int)((uVar11 + uVar10 * *(int *)(local_2a8 + 0x2c)) *
                                 *(int *)(local_2a8 + 0x18));
      }
      local_2c8[1] = (int)local_548;
      if ((0x7fffffff < uVar9 || bVar1) || (0x7fffffff < uVar12 || bVar4)) {
        in_stack_fffffffffffffab0 =
             (compute_coord<(ncnn::GridSample::PaddingMode)2,_true> *)0xbff0000000000000;
      }
      else {
        in_stack_fffffffffffffab0 =
             (compute_coord<(ncnn::GridSample::PaddingMode)2,_true> *)
             (double)(int)((uVar9 + uVar12 * *(int *)(local_2a8 + 0x2c)) *
                          *(int *)(local_2a8 + 0x18));
      }
      local_2c8[2] = (int)(double)in_stack_fffffffffffffab0;
      if ((0x7fffffff < uVar11 || bVar2) || (0x7fffffff < uVar12 || bVar4)) {
        in_stack_fffffffffffffaa8 = -1.0;
      }
      else {
        in_stack_fffffffffffffaa8 =
             (double)(int)((uVar11 + uVar12 * *(int *)(local_2a8 + 0x2c)) *
                          *(int *)(local_2a8 + 0x18));
      }
      local_2c8[3] = (int)in_stack_fffffffffffffaa8;
      local_2c8[4] = (int)(__x - (float)(int)uVar9);
      local_2c8[5] = (int)(fVar13 - (float)(int)uVar10);
      local_3a8 = local_3a8 + 1;
      local_3f8 = local_3f8 + 1;
      local_2c8 = local_2c8 + 6;
    }
  }
  return;
}

Assistant:

void gridsample_2d_bilinear_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h;

    float* offset_value_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 15 < grid_size; x += 16)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);

                transpose2x8_ps(gx, gy);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                __m256 x_w = _mm256_floor_ps(gx);
                __m256 y_n = _mm256_floor_ps(gy);

                __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
                __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));

                __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
                __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
                __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
                __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));

                __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
                __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
                __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
                __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

                __m256 nw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w), _mm256_set1_ps(src.elempack));
                __m256 ne_offset = _mm256_add_ps(nw_offset, _mm256_set1_ps(src.elempack));
                __m256 sw_offset = _mm256_comp_fmadd_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack), nw_offset);
                __m256 se_offset = _mm256_add_ps(sw_offset, _mm256_set1_ps(src.elempack));

                nw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), nw_offset, v00_in_range);
                ne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), ne_offset, v01_in_range);
                sw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), sw_offset, v10_in_range);
                se_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), se_offset, v11_in_range);

                nw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(nw_offset));
                ne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(ne_offset));
                sw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(sw_offset));
                se_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(se_offset));

                __m256 alpha = _mm256_sub_ps(gx, x_w);
                __m256 beta = _mm256_sub_ps(gy, y_n);

                transpose8x6_ps(nw_offset, ne_offset, sw_offset, se_offset, alpha, beta);

                _mm256_storeu_ps(offset_value_ptr, nw_offset);
                _mm256_storeu_ps(offset_value_ptr + 8, ne_offset);
                _mm256_storeu_ps(offset_value_ptr + 16, sw_offset);
                _mm256_storeu_ps(offset_value_ptr + 24, se_offset);

                _mm256_storeu_ps(offset_value_ptr + 32, alpha);
                _mm256_storeu_ps(offset_value_ptr + 40, beta);

                gridptr += 16;
                offset_value_ptr += 48;
            }
#endif // __AVX__

            for (; x < grid_size; x += 2)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                int x0 = (int)floorf(sample_x);
                int y0 = (int)floorf(sample_y);
                int x1 = x0 + 1;
                int y1 = y0 + 1;

                bool x0_in_bound = (x0 > -1) & (x0 < src.w);
                bool x1_in_bound = (x1 > -1) & (x1 < src.w);
                bool y0_in_bound = (y0 > -1) & (y0 < src.h);
                bool y1_in_bound = (y1 > -1) & (y1 < src.h);

                bool in_bound_00 = x0_in_bound & y0_in_bound;
                bool in_bound_01 = x1_in_bound & y0_in_bound;
                bool in_bound_10 = x0_in_bound & y1_in_bound;
                bool in_bound_11 = x1_in_bound & y1_in_bound;

                int* offset_ptr = (int*)offset_value_ptr;
                float* value_ptr = offset_value_ptr + 4;

                offset_ptr[0] = in_bound_00 ? (x0 + y0 * src.w) * src.elempack : -1.0;
                offset_ptr[1] = in_bound_01 ? (x1 + y0 * src.w) * src.elempack : -1.0;
                offset_ptr[2] = in_bound_10 ? (x0 + y1 * src.w) * src.elempack : -1.0;
                offset_ptr[3] = in_bound_11 ? (x1 + y1 * src.w) * src.elempack : -1.0;

                value_ptr[0] = sample_x - x0;
                value_ptr[1] = sample_y - y0;

                gridptr += 2;
                offset_value_ptr += 6;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            __m256 x_w = _mm256_floor_ps(gx);
            __m256 y_n = _mm256_floor_ps(gy);

            __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
            __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));

            __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
            __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
            __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
            __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));

            __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
            __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
            __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
            __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

            __m256 nw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w), _mm256_set1_ps(src.elempack));
            __m256 ne_offset = _mm256_add_ps(nw_offset, _mm256_set1_ps(src.elempack));
            __m256 sw_offset = _mm256_comp_fmadd_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack), nw_offset);
            __m256 se_offset = _mm256_add_ps(sw_offset, _mm256_set1_ps(src.elempack));

            nw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), nw_offset, v00_in_range);
            ne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), ne_offset, v01_in_range);
            sw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), sw_offset, v10_in_range);
            se_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), se_offset, v11_in_range);

            nw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(nw_offset));
            ne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(ne_offset));
            sw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(sw_offset));
            se_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(se_offset));

            __m256 alpha = _mm256_sub_ps(gx, x_w);
            __m256 beta = _mm256_sub_ps(gy, y_n);

            transpose8x6_ps(nw_offset, ne_offset, sw_offset, se_offset, alpha, beta);

            _mm256_storeu_ps(offset_value_ptr, nw_offset);
            _mm256_storeu_ps(offset_value_ptr + 8, ne_offset);
            _mm256_storeu_ps(offset_value_ptr + 16, sw_offset);
            _mm256_storeu_ps(offset_value_ptr + 24, se_offset);

            _mm256_storeu_ps(offset_value_ptr + 32, alpha);
            _mm256_storeu_ps(offset_value_ptr + 40, beta);

            gridptr_x += 8;
            gridptr_y += 8;
            offset_value_ptr += 48;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            int x0 = (int)floorf(sample_x);
            int y0 = (int)floorf(sample_y);
            int x1 = x0 + 1;
            int y1 = y0 + 1;

            bool x0_in_bound = (x0 > -1) & (x0 < src.w);
            bool x1_in_bound = (x1 > -1) & (x1 < src.w);
            bool y0_in_bound = (y0 > -1) & (y0 < src.h);
            bool y1_in_bound = (y1 > -1) & (y1 < src.h);

            bool in_bound_00 = x0_in_bound & y0_in_bound;
            bool in_bound_01 = x1_in_bound & y0_in_bound;
            bool in_bound_10 = x0_in_bound & y1_in_bound;
            bool in_bound_11 = x1_in_bound & y1_in_bound;

            int* offset_ptr = (int*)offset_value_ptr;
            float* value_ptr = offset_value_ptr + 4;

            offset_ptr[0] = in_bound_00 ? (x0 + y0 * src.w) * src.elempack : -1.0;
            offset_ptr[1] = in_bound_01 ? (x1 + y0 * src.w) * src.elempack : -1.0;
            offset_ptr[2] = in_bound_10 ? (x0 + y1 * src.w) * src.elempack : -1.0;
            offset_ptr[3] = in_bound_11 ? (x1 + y1 * src.w) * src.elempack : -1.0;

            value_ptr[0] = sample_x - x0;
            value_ptr[1] = sample_y - y0;

            gridptr_x++;
            gridptr_y++;
            offset_value_ptr += 6;
        }
    }
}